

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMStreamCreate(int device_type,int device_id,TVMStreamHandle *out)

{
  int iVar1;
  DeviceAPI *pDVar2;
  undefined4 extraout_var;
  runtime_error *_except_;
  TVMContext local_28;
  TVMContext ctx;
  TVMStreamHandle *out_local;
  int device_id_local;
  int device_type_local;
  
  local_28.device_type = device_type;
  local_28.device_id = device_id;
  ctx = (TVMContext)out;
  pDVar2 = tvm::runtime::DeviceAPIManager::Get(&local_28);
  iVar1 = (*pDVar2->_vptr_DeviceAPI[7])(pDVar2,CONCAT44(local_28.device_id,local_28.device_type));
  *(ulong *)ctx = CONCAT44(extraout_var,iVar1);
  return 0;
}

Assistant:

int TVMStreamCreate(int device_type, int device_id, TVMStreamHandle* out) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  *out = DeviceAPIManager::Get(ctx)->CreateStream(ctx);
  API_END();
}